

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

Array<capnp::Schema> * __thiscall
capnp::SchemaLoader::Impl::getAllLoaded(Array<capnp::Schema> *__return_storage_ptr__,Impl *this)

{
  Entry *pEVar1;
  Entry *schema;
  Schema *pSVar2;
  Entry *pEVar3;
  long lVar4;
  size_t elementCount;
  
  elementCount = 0;
  for (pEVar3 = (this->schemas).table.rows.builder.ptr;
      pEVar3 != (this->schemas).table.rows.builder.pos; pEVar3 = pEVar3 + 1) {
    elementCount = elementCount + (pEVar3->value->lazyInitializer == (Initializer *)0x0);
  }
  pSVar2 = (Schema *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,elementCount,elementCount,
                      kj::_::HeapArrayDisposer::Allocate_<capnp::Schema,_false,_false>::construct,
                      kj::_::HeapArrayDisposer::Allocate_<capnp::Schema,_false,_false>::destruct);
  __return_storage_ptr__->ptr = pSVar2;
  __return_storage_ptr__->size_ = elementCount;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pEVar3 = (this->schemas).table.rows.builder.ptr;
  pEVar1 = (this->schemas).table.rows.builder.pos;
  if (pEVar3 != pEVar1) {
    pSVar2 = __return_storage_ptr__->ptr;
    lVar4 = 0;
    do {
      if (pEVar3->value->lazyInitializer == (Initializer *)0x0) {
        pSVar2[lVar4].raw = &pEVar3->value->defaultBrand;
        lVar4 = lVar4 + 1;
      }
      pEVar3 = pEVar3 + 1;
    } while (pEVar3 != pEVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<Schema> SchemaLoader::Impl::getAllLoaded() const {
  size_t count = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) ++count;
  }

  kj::Array<Schema> result = kj::heapArray<Schema>(count);
  size_t i = 0;
  for (auto& schema: schemas) {
    if (schema.value->lazyInitializer == nullptr) {
      result[i++] = Schema(&schema.value->defaultBrand);
    }
  }
  return result;
}